

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int fits_unshuffle_8bytes(char *heap,LONGLONG length,int *status)

{
  void *__src;
  int *in_RDX;
  long in_RSI;
  void *in_RDI;
  char *heapptr;
  char *cptr;
  char *ptr;
  LONGLONG ii;
  undefined1 *local_38;
  undefined1 *local_30;
  long local_20;
  
  __src = malloc(in_RSI << 3);
  local_38 = (undefined1 *)((long)in_RDI + in_RSI * 8);
  local_30 = (undefined1 *)((long)__src + in_RSI * 8 + -1);
  for (local_20 = 0; local_38 = local_38 + -1, local_20 < in_RSI; local_20 = local_20 + 1) {
    *local_30 = *local_38;
    local_30[-1] = local_38[-in_RSI];
    local_30[-2] = local_38[in_RSI * -2];
    local_30[-3] = local_38[in_RSI * -3];
    local_30[-4] = local_38[in_RSI * -4];
    local_30[-5] = local_38[in_RSI * -5];
    local_30[-6] = local_38[in_RSI * -6];
    local_30[-7] = local_38[in_RSI * -7];
    local_30 = local_30 + -8;
  }
  memcpy(in_RDI,__src,in_RSI << 3);
  free(__src);
  return *in_RDX;
}

Assistant:

static int fits_unshuffle_8bytes(char *heap, LONGLONG length, int *status)

/* unshuffle the bytes in an array of 8-byte integers or doubles */

{
    LONGLONG ii;
    char *ptr, *cptr, *heapptr;
    
    ptr = malloc((size_t) (length * 8));
    heapptr = heap + (8 * length) - 1;
    cptr = ptr + (8 * length)  -1;
    
    for (ii = 0; ii < length; ii++) {
       *cptr = *heapptr;
       cptr--;
       *cptr = *(heapptr - length);
       cptr--;
       *cptr = *(heapptr - (2 * length));
       cptr--;
       *cptr = *(heapptr - (3 * length));
       cptr--;
       *cptr = *(heapptr - (4 * length));
       cptr--;
       *cptr = *(heapptr - (5 * length));
       cptr--;
       *cptr = *(heapptr - (6 * length));
       cptr--;
       *cptr = *(heapptr - (7 * length));
       cptr--;
       heapptr--;
    }
       
    memcpy(heap, ptr, (size_t) (length * 8));
    free(ptr);
    return(*status);
}